

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O1

bool isZSH(void)

{
  char *__s;
  size_t sVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __s = getenv("SHELL");
  if (__s != (char *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,__s,__s + sVar1);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&local_38,"zsh",0,3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (sVar2 != 0xffffffffffffffff) {
      return true;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] static bool isZSH() {
  if (let *shell = std::getenv("SHELL"))
    if (std::string(shell).find("zsh") != std::string::npos)
      return true;

  return false;
}